

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_adf.cc
# Opt level: O3

bool CB_ADF::update_statistics(vw *all,cb_adf *c,example *ec,multi_ex *ec_seq)

{
  float fVar1;
  uint32_t uVar2;
  bool bVar3;
  ulong uVar4;
  pointer ppeVar5;
  wclass *pwVar6;
  ulong uVar7;
  size_t num_features;
  float fVar8;
  
  ppeVar5 = (ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  uVar2 = ((ec->pred).a_s._begin)->action;
  if ((ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
      super__Vector_impl_data._M_finish == ppeVar5) {
    uVar4 = 0;
    num_features = 0;
  }
  else {
    uVar7 = 0;
    num_features = 0;
    do {
      bVar3 = CB::ec_is_example_header(ppeVar5[uVar7]);
      ppeVar5 = (ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                super__Vector_impl_data._M_start;
      if (!bVar3) {
        num_features = num_features + ppeVar5[uVar7]->num_features;
      }
      uVar7 = uVar7 + 1;
      uVar4 = (long)(ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                    super__Vector_impl_data._M_finish - (long)ppeVar5 >> 3;
    } while (uVar7 < uVar4);
  }
  fVar1 = (c->gen_cs).known_cost.probability;
  fVar8 = 0.0;
  bVar3 = 0.0 < fVar1;
  if (0.0 < fVar1) {
    for (pwVar6 = (c->gen_cs).pred_scores.costs._begin; pwVar6 != (c->gen_cs).pred_scores.costs._end
        ; pwVar6 = pwVar6 + 1) {
      if (pwVar6->class_index == uVar2) {
        if ((c->gen_cs).known_cost.action == uVar2) {
          fVar8 = ((c->gen_cs).known_cost.cost - pwVar6->x) / fVar1;
        }
        else {
          fVar8 = 0.0;
        }
        fVar8 = pwVar6->x + fVar8;
        goto LAB_0024b96e;
      }
    }
    if ((c->gen_cs).known_cost.action == uVar2) {
      fVar8 = (c->gen_cs).known_cost.cost / fVar1;
    }
  }
LAB_0024b96e:
  if (uVar4 != 0) {
    uVar7 = 0;
    do {
      bVar3 = (bool)(bVar3 & ppeVar5[uVar7]->test_only);
      uVar7 = uVar7 + 1;
    } while (uVar4 != uVar7);
  }
  shared_data::update(all->sd,bVar3,0.0 < fVar1,fVar8,ec->weight,num_features);
  return 0.0 < fVar1;
}

Assistant:

bool update_statistics(vw& all, cb_adf& c, example& ec, multi_ex* ec_seq)
{
  size_t num_features = 0;

  uint32_t action = ec.pred.a_s[0].action;
  for (size_t i = 0; i < (*ec_seq).size(); i++)
    if (!CB::ec_is_example_header(*(*ec_seq)[i]))
      num_features += (*ec_seq)[i]->num_features;

  float loss = 0.;

  bool labeled_example = true;
  if (c.gen_cs.known_cost.probability > 0)
    loss = get_unbiased_cost(&(c.gen_cs.known_cost), c.gen_cs.pred_scores, action);
  else
    labeled_example = false;

  bool holdout_example = labeled_example;
  for (size_t i = 0; i < ec_seq->size(); i++) holdout_example &= (*ec_seq)[i]->test_only;

  all.sd->update(holdout_example, labeled_example, loss, ec.weight, num_features);
  return labeled_example;
}